

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall
QList<std::pair<double,_QVariant>_>::data(QList<std::pair<double,_QVariant>_> *this)

{
  QArrayDataPointer<std::pair<double,_QVariant>_> *this_00;
  pair<double,_QVariant> *ppVar1;
  QArrayDataPointer<std::pair<double,_QVariant>_> *in_RDI;
  
  detach((QList<std::pair<double,_QVariant>_> *)0x69449c);
  this_00 = (QArrayDataPointer<std::pair<double,_QVariant>_> *)
            QArrayDataPointer<std::pair<double,_QVariant>_>::operator->(in_RDI);
  ppVar1 = QArrayDataPointer<std::pair<double,_QVariant>_>::data(this_00);
  return ppVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }